

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::CopyFrom(ON_Viewport *this,ON_Object *src)

{
  ON_Viewport *pOVar1;
  ON_Viewport *s;
  ON_Object *src_local;
  ON_Viewport *this_local;
  
  pOVar1 = Cast(src);
  if ((this == (ON_Viewport *)0x0) || (pOVar1 == (ON_Viewport *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    operator=(this,pOVar1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

static double len2d( double x, double y )
{
  double d= 0.0;
  double fx = fabs(x);
  double fy = fabs(y);
  if ( fx > fy ) {
    d = fy/fx;
    d = fx*sqrt(1.0+d*d);
  }
  else if ( fy > fx ){
    d = fx/fy;
    d = fy*sqrt(1.0+d*d);
  }
  return d;
}